

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O3

void Abc_SclWriteSurfaceText(FILE *s,SC_Surface *p)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  
  fwrite("          index_1(\"",0x13,1,(FILE *)s);
  uVar1 = (p->vIndex0).nSize;
  uVar4 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    uVar6 = 0;
    do {
      pcVar5 = "    \"%s\", ";
      if (uVar6 == (int)uVar4 - 1) {
        pcVar5 = "T = %d\t\t";
      }
      fprintf((FILE *)s,"%f%s",(double)(p->vIndex0).pArray[uVar6],pcVar5 + 8);
      uVar6 = uVar6 + 1;
      uVar4 = (ulong)(p->vIndex0).nSize;
    } while ((long)uVar6 < (long)uVar4);
  }
  fwrite("\");\n",4,1,(FILE *)s);
  fwrite("          index_2(\"",0x13,1,(FILE *)s);
  uVar1 = (p->vIndex1).nSize;
  uVar4 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    uVar6 = 0;
    do {
      pcVar5 = "    \"%s\", ";
      if (uVar6 == (int)uVar4 - 1) {
        pcVar5 = "T = %d\t\t";
      }
      fprintf((FILE *)s,"%f%s",(double)(p->vIndex1).pArray[uVar6],pcVar5 + 8);
      uVar6 = uVar6 + 1;
      uVar4 = (ulong)(p->vIndex1).nSize;
    } while ((long)uVar6 < (long)uVar4);
  }
  fwrite("\");\n",4,1,(FILE *)s);
  fwrite("          values (\"",0x13,1,(FILE *)s);
  uVar1 = (p->vData).nSize;
  uVar4 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    uVar6 = 0;
    do {
      iVar3 = (int)uVar4;
      pvVar2 = (p->vData).pArray[uVar6];
      uVar4 = (ulong)*(uint *)((long)pvVar2 + 4);
      if (0 < (int)*(uint *)((long)pvVar2 + 4)) {
        uVar7 = 0;
        do {
          pcVar5 = ", ";
          if ((int)uVar4 - 1 == uVar7 && (p->vData).nSize - 1 == uVar6) {
            pcVar5 = "\");";
          }
          fprintf((FILE *)s,"%f%s",(double)*(float *)(*(long *)((long)pvVar2 + 8) + uVar7 * 4),
                  pcVar5);
          uVar7 = uVar7 + 1;
          uVar4 = (ulong)*(int *)((long)pvVar2 + 4);
        } while ((long)uVar7 < (long)uVar4);
        iVar3 = (p->vData).nSize;
      }
      if (uVar6 == iVar3 - 1) {
        fputc(10,(FILE *)s);
      }
      else {
        fwrite("\\\n",2,1,(FILE *)s);
        fwrite("                   ",0x13,1,(FILE *)s);
      }
      uVar6 = uVar6 + 1;
      uVar4 = (ulong)(p->vData).nSize;
    } while ((long)uVar6 < (long)uVar4);
  }
  return;
}

Assistant:

static void Abc_SclWriteSurfaceText( FILE * s, SC_Surface * p )
{
    Vec_Flt_t * vVec;
    float Entry;
    int i, k;

    fprintf( s, "          index_1(\"" );  
    Vec_FltForEachEntry( &p->vIndex0, Entry, i )
        fprintf( s, "%f%s", Entry, i == Vec_FltSize(&p->vIndex0)-1 ? "":", " );
    fprintf( s, "\");\n" );

    fprintf( s, "          index_2(\"" );  
    Vec_FltForEachEntry( &p->vIndex1, Entry, i )
        fprintf( s, "%f%s", Entry, i == Vec_FltSize(&p->vIndex1)-1 ? "":", " );
    fprintf( s, "\");\n" );

    fprintf( s, "          values (\"" );  
    Vec_PtrForEachEntry( Vec_Flt_t *, &p->vData, vVec, i )
    {
        Vec_FltForEachEntry( vVec, Entry, k )
            fprintf( s, "%f%s", Entry, i == Vec_PtrSize(&p->vData)-1 && k == Vec_FltSize(vVec)-1 ? "\");":", " );
        if ( i == Vec_PtrSize(&p->vData)-1 )
            fprintf( s, "\n" );
        else
        {
            fprintf( s, "\\\n" );
            fprintf( s, "                   " );  
        }
    }
/*
    fprintf( s, "       approximations: \n" );
    fprintf( s, "       " );
    for ( i = 0; i < 3; i++ ) 
        fprintf( s, "%f ", p->approx[0][i] );
    fprintf( s, "\n" );
    fprintf( s, "       " );
    for ( i = 0; i < 4; i++ ) 
        fprintf( s, "%f ", p->approx[1][i] );
    fprintf( s, "\n" );
    fprintf( s, "       " );
    for ( i = 0; i < 6; i++ ) 
        fprintf( s, "%f ", p->approx[2][i] );
    fprintf( s, "\n" );
    fprintf( s, "       \n" );
*/
}